

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O3

arth * gen_arth(compiler_state_t *cstate,int code,arth *a0,arth *a1)

{
  slist *psVar1;
  int iVar2;
  slist *psVar3;
  slist *psVar4;
  slist *psVar5;
  slist *psVar6;
  char *fmt;
  
  if (code == 0x90) {
    if (((a1->s->s).code != 0) || ((a1->s->s).k != 0)) goto LAB_0010f4cc;
    fmt = "modulus by zero";
  }
  else {
    if (((code != 0x30) || ((a1->s->s).code != 0)) || ((a1->s->s).k != 0)) {
LAB_0010f4cc:
      psVar3 = (slist *)newchunk(cstate,0x28);
      (psVar3->s).code = 0x61;
      (psVar3->s).k = a1->regno;
      psVar4 = (slist *)newchunk(cstate,0x28);
      (psVar4->s).code = 0x60;
      (psVar4->s).k = a0->regno;
      psVar5 = (slist *)newchunk(cstate,0x28);
      (psVar5->s).code = code | 0xc;
      psVar1 = psVar4;
      do {
        psVar6 = psVar1;
        psVar1 = psVar6->next;
      } while (psVar1 != (slist *)0x0);
      psVar6->next = psVar5;
      psVar1 = psVar3;
      do {
        psVar5 = psVar1;
        psVar1 = psVar5->next;
      } while (psVar1 != (slist *)0x0);
      psVar5->next = psVar4;
      psVar1 = a1->s;
      psVar4 = psVar1;
      do {
        psVar5 = psVar4;
        psVar4 = psVar5->next;
      } while (psVar4 != (slist *)0x0);
      psVar5->next = psVar3;
      psVar3 = a0->s;
      do {
        psVar4 = psVar3;
        psVar3 = psVar4->next;
      } while (psVar3 != (slist *)0x0);
      psVar4->next = psVar1;
      cstate->regused[a0->regno] = 0;
      cstate->regused[a1->regno] = 0;
      psVar3 = (slist *)newchunk(cstate,0x28);
      (psVar3->s).code = 2;
      iVar2 = alloc_reg(cstate);
      (psVar3->s).k = iVar2;
      a0->regno = iVar2;
      psVar1 = a0->s;
      do {
        psVar4 = psVar1;
        psVar1 = psVar4->next;
      } while (psVar1 != (slist *)0x0);
      psVar4->next = psVar3;
      return a0;
    }
    fmt = "division by zero";
  }
  bpf_error(cstate,fmt);
}

Assistant:

struct arth *
gen_arth(compiler_state_t *cstate, int code, struct arth *a0,
    struct arth *a1)
{
	struct slist *s0, *s1, *s2;

	/*
	 * Disallow division by, or modulus by, zero; we do this here
	 * so that it gets done even if the optimizer is disabled.
	 */
	if (code == BPF_DIV) {
		if (a1->s->s.code == (BPF_LD|BPF_IMM) && a1->s->s.k == 0)
			bpf_error(cstate, "division by zero");
	} else if (code == BPF_MOD) {
		if (a1->s->s.code == (BPF_LD|BPF_IMM) && a1->s->s.k == 0)
			bpf_error(cstate, "modulus by zero");
	}
	s0 = xfer_to_x(cstate, a1);
	s1 = xfer_to_a(cstate, a0);
	s2 = new_stmt(cstate, BPF_ALU|BPF_X|code);

	sappend(s1, s2);
	sappend(s0, s1);
	sappend(a1->s, s0);
	sappend(a0->s, a1->s);

	free_reg(cstate, a0->regno);
	free_reg(cstate, a1->regno);

	s0 = new_stmt(cstate, BPF_ST);
	a0->regno = s0->s.k = alloc_reg(cstate);
	sappend(a0->s, s0);

	return a0;
}